

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

ssh_ttymodes * get_ttymodes_from_conf(ssh_ttymodes *__return_storage_ptr__,Seat *seat,Conf *conf)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint local_50;
  uint local_4c;
  uint ispeed;
  uint ospeed;
  char *next;
  char *pcStack_38;
  uint ival;
  char *to_free;
  char *sval;
  mode_name_type *mode;
  size_t i;
  Conf *conf_local;
  Seat *seat_local;
  
  i = (size_t)conf;
  conf_local = (Conf *)seat;
  memset(__return_storage_ptr__,0,0x50c);
  mode = (mode_name_type *)0x0;
  do {
    if ((mode_name_type *)0x35 < mode) {
      local_50 = 0x9600;
      local_4c = 0x9600;
      pcVar3 = conf_get_str((Conf *)i,0x36);
      __isoc99_sscanf(pcVar3,"%u,%u",&local_4c,&local_50);
      __return_storage_ptr__->have_mode[0x100] = true;
      __return_storage_ptr__->mode_val[0x100] = local_50;
      __return_storage_ptr__->have_mode[0x101] = true;
      __return_storage_ptr__->mode_val[0x101] = local_4c;
      return __return_storage_ptr__;
    }
    sval = (char *)(get_ttymodes_from_conf::modes_names_types + (long)mode);
    to_free = conf_get_str_str((Conf *)i,0x37,((mode_name_type *)sval)->mode);
    pcStack_38 = (char *)0x0;
    if (to_free == (char *)0x0) {
      to_free = "N";
    }
    if (*to_free == 'A') {
      pcStack_38 = seat_get_ttymode((Seat *)conf_local,*(char **)sval);
      to_free = pcStack_38;
LAB_001274ba:
      if (to_free != (char *)0x0) {
        next._4_4_ = 0;
        if (*(int *)(sval + 0xc) == 0) {
          if (*to_free == '\0') {
            next._4_4_ = 0xff;
          }
          else {
            _ispeed = (char *)0x0;
            cVar1 = ctrlparse(to_free,(char **)&ispeed);
            if (_ispeed == (char *)0x0) {
              cVar1 = *to_free;
            }
            next._4_4_ = (uint)cVar1;
          }
        }
        else {
          if (*(int *)(sval + 0xc) != 1) {
            __assert_fail("false && \"Bad mode->type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                          ,0x1de,"struct ssh_ttymodes get_ttymodes_from_conf(Seat *, Conf *)");
          }
          iVar2 = strcasecmp(to_free,"yes");
          if ((((iVar2 == 0) || (iVar2 = strcasecmp(to_free,"on"), iVar2 == 0)) ||
              (iVar2 = strcasecmp(to_free,"true"), iVar2 == 0)) ||
             (iVar2 = strcasecmp(to_free,"+"), iVar2 == 0)) {
            next._4_4_ = 1;
          }
          else {
            iVar2 = strcasecmp(to_free,"no");
            if (((iVar2 == 0) || (iVar2 = strcasecmp(to_free,"off"), iVar2 == 0)) ||
               ((iVar2 = strcasecmp(to_free,"false"), iVar2 == 0 ||
                (iVar2 = strcasecmp(to_free,"-"), iVar2 == 0)))) {
              next._4_4_ = 0;
            }
            else {
              iVar2 = atoi(to_free);
              next._4_4_ = (uint)(iVar2 != 0);
            }
          }
        }
        __return_storage_ptr__->have_mode[*(int *)(sval + 8)] = true;
        __return_storage_ptr__->mode_val[*(int *)(sval + 8)] = next._4_4_;
      }
      safefree(pcStack_38);
    }
    else if (*to_free == 'V') {
      to_free = to_free + 1;
      goto LAB_001274ba;
    }
    mode = (mode_name_type *)((long)&mode->mode + 1);
  } while( true );
}

Assistant:

struct ssh_ttymodes get_ttymodes_from_conf(Seat *seat, Conf *conf)
{
    struct ssh_ttymodes modes;
    size_t i;

    static const struct mode_name_type {
        const char *mode;
        int opcode;
        enum { TYPE_CHAR, TYPE_BOOL } type;
    } modes_names_types[] = {
        #define TTYMODE_CHAR(name, val, index) { #name, val, TYPE_CHAR },
        #define TTYMODE_FLAG(name, val, field, mask) { #name, val, TYPE_BOOL },
        #include "ttymode-list.h"
        #undef TTYMODE_CHAR
        #undef TTYMODE_FLAG
    };

    memset(&modes, 0, sizeof(modes));

    for (i = 0; i < lenof(modes_names_types); i++) {
        const struct mode_name_type *mode = &modes_names_types[i];
        const char *sval = conf_get_str_str(conf, CONF_ttymodes, mode->mode);
        char *to_free = NULL;

        if (!sval)
            sval = "N";                /* just in case */

        /*
         * sval[0] can be
         *  - 'V', indicating that an explicit value follows it;
         *  - 'A', indicating that we should pass the value through from
         *    the local environment via get_ttymode; or
         *  - 'N', indicating that we should explicitly not send this
         *    mode.
         */
        if (sval[0] == 'A') {
            sval = to_free = seat_get_ttymode(seat, mode->mode);
        } else if (sval[0] == 'V') {
            sval++;                    /* skip the 'V' */
        } else {
            /* else 'N', or something from the future we don't understand */
            continue;
        }

        if (sval) {
            /*
             * Parse the string representation of the tty mode
             * into the integer value it will take on the wire.
             */
            unsigned ival = 0;

            switch (mode->type) {
              case TYPE_CHAR:
                if (*sval) {
                    char *next = NULL;
                    /* We know ctrlparse won't write to the string, so
                     * casting away const is ugly but allowable. */
                    ival = ctrlparse((char *)sval, &next);
                    if (!next)
                        ival = sval[0];
                } else {
                    ival = 255; /* special value meaning "don't set" */
                }
                break;
              case TYPE_BOOL:
                if (stricmp(sval, "yes") == 0 ||
                    stricmp(sval, "on") == 0 ||
                    stricmp(sval, "true") == 0 ||
                    stricmp(sval, "+") == 0)
                    ival = 1;      /* true */
                else if (stricmp(sval, "no") == 0 ||
                         stricmp(sval, "off") == 0 ||
                         stricmp(sval, "false") == 0 ||
                         stricmp(sval, "-") == 0)
                    ival = 0;      /* false */
                else
                    ival = (atoi(sval) != 0);
                break;
              default:
                unreachable("Bad mode->type");
            }

            modes.have_mode[mode->opcode] = true;
            modes.mode_val[mode->opcode] = ival;
        }

        sfree(to_free);
    }

    {
        unsigned ospeed, ispeed;

        /* Unpick the terminal-speed config string. */
        ospeed = ispeed = 38400;           /* last-resort defaults */
        sscanf(conf_get_str(conf, CONF_termspeed), "%u,%u", &ospeed, &ispeed);
        /* Currently we unconditionally set these */
        modes.have_mode[TTYMODE_ISPEED] = true;
        modes.mode_val[TTYMODE_ISPEED] = ispeed;
        modes.have_mode[TTYMODE_OSPEED] = true;
        modes.mode_val[TTYMODE_OSPEED] = ospeed;
    }

    return modes;
}